

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  string local_30 [36];
  undefined4 local_c;
  
  local_c = 0;
  get_libc_version_abi_cxx11_();
  poVar1 = std::operator<<((ostream *)&std::cout,local_30);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string(local_30);
  return 0;
}

Assistant:

int main(){
    std::cout << get_libc_version() << "\n";
    return 0;
}